

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O0

duckdb_logical_type duckdb_create_array_type(duckdb_logical_type type,idx_t array_size)

{
  ulong in_RSI;
  LogicalType *in_RDI;
  LogicalType *in_stack_00000020;
  optional_idx in_stack_00000028;
  LogicalType *ltype;
  LogicalType *in_stack_ffffffffffffff98;
  idx_t in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  if (in_RDI == (LogicalType *)0x0) {
    local_8 = (duckdb_logical_type)0x0;
  }
  else if (in_RSI < 100000) {
    local_8 = (duckdb_logical_type)operator_new(0x18);
    duckdb::LogicalType::LogicalType((LogicalType *)0x1912717);
    duckdb::optional_idx::optional_idx((optional_idx *)local_8,in_stack_ffffffffffffffd8);
    duckdb::LogicalType::ARRAY(in_stack_00000020,in_stack_00000028);
    duckdb::LogicalType::operator=(in_RDI,in_stack_ffffffffffffff98);
    duckdb::LogicalType::~LogicalType((LogicalType *)0x1912769);
  }
  else {
    local_8 = (duckdb_logical_type)0x0;
  }
  return local_8;
}

Assistant:

duckdb_logical_type duckdb_create_array_type(duckdb_logical_type type, idx_t array_size) {
	if (!type) {
		return nullptr;
	}
	if (array_size >= duckdb::ArrayType::MAX_ARRAY_SIZE) {
		return nullptr;
	}
	duckdb::LogicalType *ltype = new duckdb::LogicalType;
	*ltype = duckdb::LogicalType::ARRAY(*reinterpret_cast<duckdb::LogicalType *>(type), array_size);
	return reinterpret_cast<duckdb_logical_type>(ltype);
}